

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

void htmlDocDumpMemoryFormat(xmlDocPtr cur,xmlChar **mem,int *size,int format)

{
  xmlChar *pxVar1;
  xmlCharEncodingHandler *encoder;
  xmlOutputBufferPtr buf_00;
  size_t sVar2;
  char *encoding;
  xmlCharEncodingHandlerPtr handler;
  xmlOutputBufferPtr buf;
  int format_local;
  int *size_local;
  xmlChar **mem_local;
  xmlDocPtr cur_local;
  
  xmlInitParser();
  if ((mem != (xmlChar **)0x0) && (size != (int *)0x0)) {
    *mem = (xmlChar *)0x0;
    *size = 0;
    if (cur != (xmlDocPtr)0x0) {
      pxVar1 = htmlGetMetaEncoding(cur);
      encoder = htmlFindOutputEncoder((char *)pxVar1);
      buf_00 = xmlAllocOutputBuffer(encoder);
      if (buf_00 != (xmlOutputBufferPtr)0x0) {
        htmlDocContentDumpFormatOutput(buf_00,cur,(char *)0x0,format);
        xmlOutputBufferFlush(buf_00);
        if (buf_00->error == 0) {
          if (buf_00->conv == (xmlBufPtr)0x0) {
            sVar2 = xmlBufUse(buf_00->buffer);
            *size = (int)sVar2;
            pxVar1 = xmlBufContent(buf_00->buffer);
            pxVar1 = xmlStrndup(pxVar1,*size);
            *mem = pxVar1;
          }
          else {
            sVar2 = xmlBufUse(buf_00->conv);
            *size = (int)sVar2;
            pxVar1 = xmlBufContent(buf_00->conv);
            pxVar1 = xmlStrndup(pxVar1,*size);
            *mem = pxVar1;
          }
        }
        xmlOutputBufferClose(buf_00);
      }
    }
  }
  return;
}

Assistant:

void
htmlDocDumpMemoryFormat(xmlDocPtr cur, xmlChar**mem, int *size, int format) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;
    const char *encoding;

    xmlInitParser();

    if ((mem == NULL) || (size == NULL))
        return;
    *mem = NULL;
    *size = 0;
    if (cur == NULL)
	return;

    encoding = (const char *) htmlGetMetaEncoding(cur);
    handler = htmlFindOutputEncoder(encoding);
    buf = xmlAllocOutputBuffer(handler);
    if (buf == NULL)
	return;

    htmlDocContentDumpFormatOutput(buf, cur, NULL, format);

    xmlOutputBufferFlush(buf);

    if (!buf->error) {
        if (buf->conv != NULL) {
            *size = xmlBufUse(buf->conv);
            *mem = xmlStrndup(xmlBufContent(buf->conv), *size);
        } else {
            *size = xmlBufUse(buf->buffer);
            *mem = xmlStrndup(xmlBufContent(buf->buffer), *size);
        }
    }

    xmlOutputBufferClose(buf);
}